

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::setSizeGripEnabled(QStatusBar *this,bool enabled)

{
  byte bVar1;
  bool bVar2;
  QStatusBarPrivate *parent;
  QSizeGrip *pQVar3;
  byte in_SIL;
  QStatusBarPrivate *d;
  QStatusBar *in_stack_00000088;
  QStatusBarPrivate *in_stack_ffffffffffffffd0;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  parent = d_func((QStatusBar *)0x6a2fc5);
  if ((bool)((bVar1 ^ 0xff) & 1) != (parent->resizer == (QSizeGrip *)0x0)) {
    if ((bVar1 & 1) == 0) {
      in_stack_ffffffffffffffd0 = (QStatusBarPrivate *)parent->resizer;
      if (in_stack_ffffffffffffffd0 != (QStatusBarPrivate *)0x0) {
        (**(code **)(*(long *)&in_stack_ffffffffffffffd0->super_QWidgetPrivate + 0x20))();
      }
      parent->resizer = (QSizeGrip *)0x0;
      parent->showSizeGrip = false;
    }
    else {
      pQVar3 = (QSizeGrip *)operator_new(0x28);
      QSizeGrip::QSizeGrip((QSizeGrip *)CONCAT17(bVar1,in_stack_fffffffffffffff0),(QWidget *)parent)
      ;
      parent->resizer = pQVar3;
      QWidget::hide((QWidget *)0x6a303b);
      QObject::installEventFilter((QObject *)parent->resizer);
      parent->showSizeGrip = true;
    }
    reformat(in_stack_00000088);
    if ((parent->resizer != (QSizeGrip *)0x0) &&
       (bVar2 = QWidget::isVisible((QWidget *)0x6a30c0), bVar2)) {
      QStatusBarPrivate::tryToShowSizeGrip(in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void QStatusBar::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QStatusBar);
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            d->resizer->hide();
            d->resizer->installEventFilter(this);
            d->showSizeGrip = true;
        } else {
            delete d->resizer;
            d->resizer = nullptr;
            d->showSizeGrip = false;
        }
        reformat();
        if (d->resizer && isVisible())
            d->tryToShowSizeGrip();
    }
#endif
}